

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O2

ElementType __thiscall
Corrade::Containers::StridedArrayView<1U,_const_long_long>::operator[]
          (StridedArrayView<1U,_const_long_long> *this,size_t i)

{
  ostream *output;
  Debug *pDVar1;
  Error local_40;
  
  if (i < (this->_size)._data[0]) {
    return (ElementType)(i * (this->_stride)._data[0] + (long)this->_data);
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&local_40,output,(Flags)0x0);
  pDVar1 = Utility::Debug::operator<<
                     (&local_40.super_Debug,"Containers::StridedArrayView::operator[](): index");
  pDVar1 = Utility::Debug::operator<<(pDVar1,i);
  pDVar1 = Utility::Debug::operator<<(pDVar1,"out of range for");
  pDVar1 = Utility::Debug::operator<<(pDVar1,(this->_size)._data[0]);
  Utility::Debug::operator<<(pDVar1,"elements");
  Utility::Error::~Error(&local_40);
  abort();
}

Assistant:

auto StridedArrayView<dimensions, T>::operator[](const std::size_t i) const -> ElementType {
    CORRADE_DEBUG_ASSERT(i < _size._data[0], "Containers::StridedArrayView::operator[](): index" << i << "out of range for" << _size._data[0] << "elements", (Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i)));
    return Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i);
}